

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureType::clear_Type(FeatureType *this)

{
  TypeCase TVar1;
  FeatureType *this_local;
  
  TVar1 = Type_case(this);
  switch(TVar1) {
  case TYPE_NOT_SET:
    break;
  case kInt64Type:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kDoubleType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kStringType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kImageType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kMultiArrayType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kDictionaryType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSequenceType:
    if ((this->Type_).int64type_ != (Int64FeatureType *)0x0) {
      (*(((this->Type_).int64type_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void FeatureType::clear_Type() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.FeatureType)
  switch (Type_case()) {
    case kInt64Type: {
      delete Type_.int64type_;
      break;
    }
    case kDoubleType: {
      delete Type_.doubletype_;
      break;
    }
    case kStringType: {
      delete Type_.stringtype_;
      break;
    }
    case kImageType: {
      delete Type_.imagetype_;
      break;
    }
    case kMultiArrayType: {
      delete Type_.multiarraytype_;
      break;
    }
    case kDictionaryType: {
      delete Type_.dictionarytype_;
      break;
    }
    case kSequenceType: {
      delete Type_.sequencetype_;
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = TYPE_NOT_SET;
}